

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btCompoundCollisionAlgorithm::preallocateChildAlgorithms
          (btCompoundCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap)

{
  btCollisionObjectWrapper *parent;
  btDbvt *pbVar1;
  btCollisionAlgorithm **ppbVar2;
  btCollisionShape *shape;
  btCollisionObject *collisionObject;
  btTransform *worldTransform;
  btCollisionAlgorithm *pbVar3;
  btCollisionObjectWrapper *in_RDX;
  btCollisionObjectWrapper *in_RSI;
  long in_RDI;
  btCollisionObjectWrapper childWrap;
  btCollisionShape *childShape;
  int i;
  int numChildren;
  btCompoundShape *compoundShape;
  btCollisionObjectWrapper *otherObjWrap;
  btCollisionObjectWrapper *colObjWrap;
  int in_stack_ffffffffffffff4c;
  btCompoundShape *in_stack_ffffffffffffff50;
  btCollisionAlgorithm **in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  int newsize;
  btAlignedObjectArray<btCollisionAlgorithm_*> *in_stack_ffffffffffffff70;
  btCollisionObjectWrapper *local_88;
  btCollisionObjectWrapper *local_80;
  btCollisionObjectWrapper local_70;
  btCollisionShape *local_48;
  undefined8 local_40;
  int local_38;
  int local_34;
  btCompoundShape *local_30;
  btCollisionObjectWrapper *local_28;
  btCollisionObjectWrapper *local_20;
  
  newsize = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_80 = in_RSI;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    local_80 = in_RDX;
  }
  local_20 = local_80;
  local_88 = in_RDX;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    local_88 = in_RSI;
  }
  local_28 = local_88;
  local_30 = (btCompoundShape *)btCollisionObjectWrapper::getCollisionShape(local_80);
  local_34 = btCompoundShape::getNumChildShapes((btCompoundShape *)0x18e991);
  local_40 = 0;
  btAlignedObjectArray<btCollisionAlgorithm_*>::resize
            (in_stack_ffffffffffffff70,newsize,in_stack_ffffffffffffff60);
  for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
    pbVar1 = btCompoundShape::getDynamicAabbTree(local_30);
    if (pbVar1 == (btDbvt *)0x0) {
      shape = btCompoundShape::getChildShape(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      parent = local_20;
      local_48 = shape;
      collisionObject = btCollisionObjectWrapper::getCollisionObject(local_20);
      worldTransform = btCollisionObjectWrapper::getWorldTransform(local_20);
      btCollisionObjectWrapper::btCollisionObjectWrapper
                (&local_70,parent,shape,collisionObject,worldTransform,-1,local_38);
      pbVar3 = (btCollisionAlgorithm *)
               (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                         (*(long **)(in_RDI + 8),&local_70,local_28,*(undefined8 *)(in_RDI + 0x38));
      ppbVar2 = btAlignedObjectArray<btCollisionAlgorithm_*>::operator[]
                          ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10),local_38)
      ;
      *ppbVar2 = pbVar3;
    }
    else {
      ppbVar2 = btAlignedObjectArray<btCollisionAlgorithm_*>::operator[]
                          ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10),local_38)
      ;
      *ppbVar2 = (btCollisionAlgorithm *)0x0;
    }
  }
  return;
}

Assistant:

void	btCompoundCollisionAlgorithm::preallocateChildAlgorithms(const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap)
{
	const btCollisionObjectWrapper* colObjWrap = m_isSwapped? body1Wrap : body0Wrap;
	const btCollisionObjectWrapper* otherObjWrap = m_isSwapped? body0Wrap : body1Wrap;
	btAssert (colObjWrap->getCollisionShape()->isCompound());
	
	const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(colObjWrap->getCollisionShape());

	int numChildren = compoundShape->getNumChildShapes();
	int i;
	
	m_childCollisionAlgorithms.resize(numChildren);
	for (i=0;i<numChildren;i++)
	{
		if (compoundShape->getDynamicAabbTree())
		{
			m_childCollisionAlgorithms[i] = 0;
		} else
		{
			
			const btCollisionShape* childShape = compoundShape->getChildShape(i);

			btCollisionObjectWrapper childWrap(colObjWrap,childShape,colObjWrap->getCollisionObject(),colObjWrap->getWorldTransform(),-1,i);//wrong child trans, but unused (hopefully)
			m_childCollisionAlgorithms[i] = m_dispatcher->findAlgorithm(&childWrap,otherObjWrap,m_sharedManifold);
		}
	}
}